

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.hpp
# Opt level: O2

void __thiscall PA4Application::RenderObjectPart::~RenderObjectPart(RenderObjectPart *this)

{
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_texture).super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_vao).super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

RenderObjectPart(const RenderObjectPart &) = delete;